

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O1

HighsCDouble __thiscall
HighsLp::objectiveCDoubleValue(HighsLp *this,vector<double,_std::allocator<double>_> *solution)

{
  long lVar1;
  double dVar2;
  double dVar3;
  HighsCDouble HVar4;
  HighsCDouble HVar5;
  
  if (0 < (long)this->num_col_) {
    HVar4.lo = 0.0;
    lVar1 = 0;
    dVar2 = this->offset_;
    do {
      dVar3 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar1] *
              (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar1];
      HVar4.hi = dVar2 + dVar3;
      HVar4.lo = HVar4.lo + (dVar2 - (HVar4.hi - dVar3)) + (dVar3 - (HVar4.hi - (HVar4.hi - dVar3)))
      ;
      lVar1 = lVar1 + 1;
      dVar2 = HVar4.hi;
    } while (this->num_col_ != lVar1);
    return HVar4;
  }
  HVar5.lo = 0.0;
  HVar5.hi = this->offset_;
  return HVar5;
}

Assistant:

HighsCDouble HighsLp::objectiveCDoubleValue(
    const std::vector<double>& solution) const {
  assert((int)solution.size() >= this->num_col_);
  HighsCDouble objective_function_value = this->offset_;
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++)
    objective_function_value += this->col_cost_[iCol] * solution[iCol];
  return objective_function_value;
}